

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall VW::ptr_queue<example>::push(ptr_queue<example> *this,example *item)

{
  size_type sVar1;
  mutex_type *in_RDI;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> *in_stack_ffffffffffffffd0;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffd0,in_RDI);
  while( true ) {
    sVar1 = std::queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_>::size
                      ((queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *)
                       0x269182);
    if (sVar1 != (in_RDI->super___mutex_base)._M_mutex.__align) break;
    std::condition_variable::wait
              ((unique_lock *)(in_RDI[3].super___mutex_base._M_mutex.__size + 0x10));
  }
  std::queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_>::push
            ((queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *)
             in_stack_ffffffffffffffd0,(value_type *)in_RDI);
  std::unique_lock<std::mutex>::unlock(in_stack_ffffffffffffffd0);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void push(T* item)
    {
      std::unique_lock<std::mutex> lock(mut);
      while (object_queue.size() == max_size)
      {
        is_not_full.wait(lock);
      }

      object_queue.push(item);

      lock.unlock();
      is_not_empty.notify_all();
    }